

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_command_buffer * nk_window_get_canvas(nk_context *ctx)

{
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4027,"struct nk_command_buffer *nk_window_get_canvas(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if ((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) {
        ctx_local = (nk_context *)0x0;
      }
      else {
        ctx_local = (nk_context *)&ctx->current->buffer;
      }
      return (nk_command_buffer *)ctx_local;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4029,"struct nk_command_buffer *nk_window_get_canvas(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x4028,"struct nk_command_buffer *nk_window_get_canvas(struct nk_context *)");
}

Assistant:

NK_API struct nk_command_buffer*
nk_window_get_canvas(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return 0;
    return &ctx->current->buffer;
}